

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

Am_Value_List * __thiscall
Am_Value_List::Append_New(Am_Value_List *this,Am_Value_List *other_value,bool unique)

{
  Am_List_Item *pAVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Am_List_Item *pAVar4;
  Am_Value_List_Data *pAVar5;
  Am_List_Item **ppAVar6;
  Am_Value v;
  Am_Value local_28;
  
  pAVar5 = this->data;
  if (pAVar5 == (Am_Value_List_Data *)0x0) {
    pAVar5 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(pAVar5);
  }
  else {
    if ((!unique) || ((pAVar5->super_Am_Wrapper).refs == 1)) goto LAB_0022d864;
    iVar3 = (*(pAVar5->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
    pAVar5 = (Am_Value_List_Data *)CONCAT44(extraout_var,iVar3);
    pAVar4 = this->item;
    if (pAVar4 != (Am_List_Item *)0x0) {
      ppAVar6 = &pAVar5->head;
      do {
        pAVar4 = pAVar4->prev;
        pAVar1 = *ppAVar6;
        ppAVar6 = &pAVar1->next;
      } while (pAVar4 != (Am_List_Item *)0x0);
      this->item = pAVar1;
    }
  }
  this->data = pAVar5;
LAB_0022d864:
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  if (other_value->data == (Am_Value_List_Data *)0x0) {
    pAVar4 = other_value->item;
  }
  else {
    pAVar4 = other_value->data->head;
    other_value->item = pAVar4;
  }
  while (pAVar4 != (Am_List_Item *)0x0) {
    Am_Value::operator=(&local_28,&pAVar4->super_Am_Value);
    if (this->data != (Am_Value_List_Data *)0x0) {
      this->item = this->data->head;
    }
    bVar2 = Member(this,&local_28);
    if (!bVar2) {
      Add(this,&local_28,Am_TAIL,false);
    }
    if (other_value->item == (Am_List_Item *)0x0) {
      if (other_value->data == (Am_Value_List_Data *)0x0) break;
      ppAVar6 = &other_value->data->head;
    }
    else {
      ppAVar6 = &other_value->item->next;
    }
    pAVar4 = *ppAVar6;
    other_value->item = pAVar4;
  }
  Am_Value::~Am_Value(&local_28);
  return this;
}

Assistant:

Am_Value_List &
Am_Value_List::Append_New(Am_Value_List &other_value, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Value_List_Data();
  Am_Value v;
  for (other_value.Start(); !other_value.Last(); other_value.Next()) {
    v = other_value.Get();
    if (!Start_Member(v))
      Add(v, Am_TAIL, false); //only need to make me unique once
  }
  return *this;
}